

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapped_membank.h
# Opt level: O1

uint8_t __thiscall
n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>::
read_byte(MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *this,
         uint16_t addr)

{
  uchar uVar1;
  unsigned_short local_2;
  
  if ((this->reader_).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar1 = (*(this->reader_)._M_invoker)((_Any_data *)&this->reader_,&local_2);
    return uVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

uint8_t read_byte(uint16_t addr) const override {
        return reader_(addr);
    }